

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O1

int command_input(int cmdidx,int rep,nh_cmd_arg *arg)

{
  bool bVar1;
  xchar x;
  xchar y;
  schar sVar2;
  schar sVar3;
  boolean bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  boolean bVar14;
  int iVar15;
  char *__format;
  short sVar16;
  monst *mon;
  ulong uVar17;
  byte *__s;
  char *f;
  byte *pbVar18;
  byte *pbVar19;
  
  if (occupation != (_func_int *)0x0 && -1 < multi) {
    iVar6 = (*occupation)();
    if (iVar6 == 0) {
      occupation = (_func_int *)0x0;
    }
    iVar6 = monster_nearby();
    if (iVar6 != 0) {
      stop_occupation();
      reset_eat();
    }
    goto LAB_0013f36b;
  }
  if ((multi == 0) || (cmdidx != -1 && 0 < multi)) {
    bVar14 = '\x01';
    saved_cmd = cmdidx;
  }
  else {
    if (multi < 1) goto LAB_0013f36b;
    if (rep == -1) {
      nomul(0,(char *)0x0);
      return 0;
    }
    if (flags.mv != '\0') {
      if ((multi < 0x50) && (multi = multi + -1, multi == 0)) {
        flags.run = 0;
        flags.mv = '\0';
        iflags.travel1 = '\0';
        flags.travel = '\0';
      }
      iVar6 = domove(u.dx,u.dy,'\0');
      if (iVar6 == 0) {
        flags.move = '\0';
        nomul(0,(char *)0x0);
      }
      goto LAB_0013f36b;
    }
    bVar14 = '\0';
    rep = multi;
  }
  do_command(saved_cmd,rep,bVar14,arg);
LAB_0013f36b:
  if (u.utotype == '\0') {
    if ((flags.move == '\0') || (flags.mv == '\0')) {
      iflags.botl = '\x01';
    }
  }
  else {
    deferred_goto();
  }
  if (vision_full_recalc != '\0') {
    vision_recalc(0);
  }
  if (multi != 0 && (iflags.runmode == 0 || flags.run == 0)) {
    if (flags.travel == '\0') {
      uVar11 = multi * -0x49249249 + 0x12492492;
    }
    else {
      uVar11 = moves * -0x49249249;
    }
    if (uVar11 < 0x24924925) {
      if (flags.run != 0) {
        iflags.botl = '\x01';
      }
      flush_screen();
    }
  }
  bVar14 = flags.move;
  if (flags.move != '\0') {
    if (delay_start == 0) {
      delay_start = moves;
    }
    youmonst.movement = youmonst.movement + -0xc;
    iVar6 = 0;
    do {
      iVar7 = encumber_msg();
      calc_attr_bonus();
      validate_timers();
      validate_light_sources();
      flags.mon_moving = '\x01';
      do {
        iVar8 = movemon();
        if (0xc < youmonst.movement) break;
      } while ((char)iVar8 != '\0');
      flags.mon_moving = '\0';
      if (0xb < youmonst.movement || (char)iVar8 != '\0') goto LAB_0013fdb3;
      mcalcdistress();
      for (mon = level->monlist; mon != (monst *)0x0; mon = mon->nmon) {
        iVar8 = mcalcmove(mon);
        mon->movement = mon->movement + (short)iVar8;
      }
      uVar11 = 0x19;
      if ((u.uevent._1_1_ & 0x20) == 0) {
        sVar2 = depth(&u.uz);
        sVar3 = depth(&dungeon_topology.d_stronghold_level);
        uVar11 = 0x46;
        if (sVar3 < sVar2) {
          uVar11 = 0x32;
        }
      }
      uVar9 = mt_random();
      if (uVar9 % uVar11 == 0) {
        makemon((permonst *)0x0,level,0,0,0);
      }
      if ((u.usteed == (monst *)0x0) || (u.umoved == '\0')) {
        uVar11 = (uint)(youmonst.data)->mmove;
        uVar17 = (ulong)uVar11;
        if ((u.uprops[0x1a].intrinsic & 0xf8ffffff) == 0 && u.uprops[0x1a].extrinsic == 0) {
          if (u.uprops[0x1a].intrinsic != 0) {
            uVar10 = mt_random();
            uVar9 = uVar11 + 6;
            if (uVar10 * -0x55555555 < 0x55555556) {
              uVar9 = uVar11;
            }
            uVar17 = (ulong)uVar9;
          }
        }
        else {
          uVar10 = mt_random();
          uVar9 = uVar11 + 0xc;
          if (0x55555555 < uVar10 * -0x55555555) {
            uVar9 = uVar11 + 6;
          }
          uVar17 = (ulong)uVar9;
        }
      }
      else {
        uVar11 = mcalcmove(u.usteed);
        uVar17 = (ulong)uVar11;
      }
      iVar8 = (int)uVar17;
      switch(iVar7) {
      case 1:
        iVar15 = iVar8 + 3;
        if (-1 < iVar8) {
          iVar15 = iVar8;
        }
        iVar15 = iVar15 >> 2;
        break;
      case 2:
        iVar15 = (int)(uVar17 >> 0x1f) + iVar8 >> 1;
        break;
      case 3:
        iVar12 = iVar8 * 3 + 3;
        if (-1 < iVar8 * 3) {
          iVar12 = iVar8 * 3;
        }
        iVar12 = iVar12 >> 2;
        goto LAB_0013f626;
      case 4:
        iVar15 = iVar8 * 7;
        iVar12 = iVar15 + 7;
        if (-1 < iVar15) {
          iVar12 = iVar15;
        }
        iVar12 = iVar12 >> 3;
LAB_0013f626:
        uVar17 = (ulong)(uint)(iVar8 - iVar12);
      default:
        goto switchD_0013f5e8_default;
      }
      uVar17 = (ulong)(uint)(iVar8 - iVar15);
switchD_0013f5e8_default:
      sVar16 = (short)uVar17 + youmonst.movement;
      youmonst.movement = 0;
      if (0 < sVar16) {
        youmonst.movement = sVar16;
      }
      settrack();
      moves = moves + 1;
      level->lastmoves = moves;
      if (flags.bypasses != '\0') {
        clear_bypasses();
      }
      if (u.uprops[0x29].intrinsic != 0) {
        glibr();
      }
      nh_timeout();
      run_regions(level);
      dgn_growths(level,'\x01','\x01');
      train_body_armor_skill();
      train_shield_skill();
      if (u.ublesscnt != 0) {
        u.ublesscnt = u.ublesscnt + -1;
      }
      iflags.botl = '\x01';
      iVar8 = 0;
      if ((u._1052_1_ & 0x10) == 0) {
        iVar8 = iVar7;
        if ((((u.umonnum == u.umonster) || ((youmonst.data)->mlet != '9')) ||
            (bVar4 = is_pool(level,(int)u.ux,(int)u.uy), bVar4 != '\0')) ||
           (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 != '\0')) {
          if ((u.umonnum == u.umonster) || (u.mhmax <= u.mh)) {
            if ((u.uhp < u.uhpmax) &&
               (((u.uprops[10].extrinsic != 0 || u.uprops[10].intrinsic != 0) ||
                 (u.umoved == '\0' || iVar7 < 2) || (((youmonst.data)->mflags1 & 0x800000) != 0))))
            {
              if ((u.ulevel < 10) || (0x55555555 < moves * -0x55555555)) {
                if (((u.uprops[10].intrinsic == 0 && u.uprops[10].extrinsic == 0) &&
                    (((youmonst.data)->mflags1 & 0x800000) == 0)) &&
                   ((9 < u.ulevel || (moves % ((int)(0x2a / (long)(u.ulevel + 2)) + 1U) != 0))))
                goto LAB_0013f91d;
                u.uhp = u.uhp + 1;
                iVar15 = u.uhpmax;
                iVar7 = u.uhp;
              }
              else {
                bVar5 = acurr(4);
                iVar7 = 1;
                if ('\f' < (char)bVar5) {
                  uVar11 = mt_random();
                  iVar15 = uVar11 % (uint)bVar5 + 1;
                  iVar7 = u.ulevel + -9;
                  if (iVar15 < u.ulevel + -9) {
                    iVar7 = iVar15;
                  }
                }
                u.uhp = iVar7 + u.uhp;
                iVar15 = u.uhpmax;
                iVar7 = u.uhp;
                if (u.uhpmax <= u.uhp) {
                  iVar7 = u.uhpmax;
                  u.uhp = u.uhpmax;
                }
              }
LAB_0013f8e7:
              iflags.botl = '\x01';
              interrupt_multi("Hit points",iVar7,iVar15);
            }
          }
          else {
            if (u.mh < 1) goto LAB_0013f915;
            if (((u.uprops[10].extrinsic != 0 || u.uprops[10].intrinsic != 0) ||
                (((youmonst.data)->mflags1 & 0x800000) != 0)) ||
               ((iVar7 < 2 && ((moves * -0x33333333 >> 2 | moves * 0x40000000) < 0xccccccd)))) {
              u.mh = u.mh + 1;
              iVar15 = u.mhmax;
              iVar7 = u.mh;
              goto LAB_0013f8e7;
            }
          }
        }
        else if (u.mh < 2) {
          if (u.mh != 1) {
LAB_0013f915:
            rehumanize();
          }
        }
        else {
          u.mh = u.mh + -1;
          iflags.botl = '\x01';
        }
      }
LAB_0013f91d:
      if ((2 < iVar8) && (u.umoved != '\0')) {
        if (iVar8 < 4) {
          if ((moves * -0x11111111 >> 1 | (uint)((moves * -0x11111111 & 1) != 0) << 0x1f) <
              0x8888889) {
LAB_0013f969:
            if (u.mh < 2 || u.umonnum == u.umonster) {
              if (u.uhp < 2 || u.umonnum != u.umonster) {
                pline("You pass out from exertion!");
                exercise(4,'\0');
                fall_asleep(-10,'\0');
              }
              else {
                u.uhp = u.uhp + -1;
              }
            }
            else {
              u.mh = u.mh + -1;
            }
          }
        }
        else if ((moves * -0x33333333 >> 1 | (uint)((moves * -0x33333333 & 1) != 0) << 0x1f) <
                 0x1999999a) goto LAB_0013f969;
      }
      if ((u.uen < u.uenmax) &&
         ((((iVar8 < 2 &&
            (moves % (uint)((int)(((urole.malenum != 0x168) + 3) * (0x26 - u.ulevel)) / 6) == 0)) ||
           (u.uprops[0x30].intrinsic != 0)) || (u.uprops[0x30].extrinsic != 0)))) {
        sVar2 = acurr(2);
        sVar3 = acurr(1);
        uVar11 = mt_random();
        u.uen = SUB164(ZEXT416(uVar11) % SEXT816((long)(((int)sVar3 + (int)sVar2) / 0xf + 1)),0) +
                u.uen + 1;
        if (u.uenmax <= u.uen) {
          u.uen = u.uenmax;
        }
        iflags.botl = '\x01';
        interrupt_multi("Magic energy",u.uen,u.uenmax);
      }
      if ((u._1052_1_ & 0x10) == 0) {
        if ((((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
             (((youmonst.data)->mflags1 & 0x2000000) != 0)) &&
            ((uVar11 = mt_random(), y = u.uy, x = u.ux, uVar11 * -0x3030303 < 0x3030304 &&
             ((tele((char *)0x0), u.ux != x || (u.uy != y)))))) &&
           (bVar4 = next_to_u(), bVar4 == '\0')) {
          check_leash(x,y);
        }
        if (((iVar6 == 1 && u.uprops[0x10].intrinsic == 0) && u.uprops[0x10].extrinsic == 0) ||
           ((iVar6 == 2 && (u.ulycn == -1)))) {
          iVar6 = 0;
        }
        if ((u.uprops[0x10].intrinsic == 0 && u.uprops[0x10].extrinsic == 0) ||
           (uVar11 = mt_random(), 0x28f5c28 < (uVar11 * -0x3d70a3d7 >> 2 | uVar11 * 0x40000000))) {
          if ((-1 < u.ulycn) && (u.umonnum == u.umonster)) {
            iVar7 = night();
            uVar11 = mt_random();
            if (SUB168(ZEXT416(uVar11) % SEXT816((long)(iVar7 * -0x14 + 0x50)),0) == 0) {
              iVar6 = 2;
            }
          }
        }
        else {
          iVar6 = 1;
        }
        if ((((iVar6 != 0) && (u.uprops[0x3d].intrinsic == 0)) && (u.uprops[0x3d].extrinsic == 0))
           && (-1 < multi)) {
          if (occupation == (_func_int *)0x0) {
            nomul(0,(char *)0x0);
          }
          else {
            stop_occupation();
          }
          if (iVar6 == 1) {
            iVar6 = 0;
            polyself('\0');
          }
          else {
            you_were();
            iVar6 = 0;
          }
        }
      }
      if ((u.uprops[0xb].extrinsic != 0 || u.uprops[0xb].intrinsic != 0) && (-1 < multi)) {
        dosearch0(1);
      }
      dosounds();
      do_storms();
      gethungry();
      age_spells();
      exerchk();
      invault();
      if ((u.uhave._0_1_ & 1) != 0) {
        amulet();
      }
      sVar2 = acurr(3);
      uVar11 = mt_random();
      if (SUB168(ZEXT416(uVar11) % SEXT816((long)sVar2 * 3 + 0x28),0) == 0) {
        uVar11 = mt_random();
        u_wipe_engr(uVar11 % 3 + 1);
      }
      if (((u.uevent._1_1_ & 0x20) != 0) && ((u._1052_1_ & 0x10) == 0)) {
        if (u.udg_cnt != 0) {
          u.udg_cnt = u.udg_cnt - 1;
        }
        if (u.udg_cnt == 0) {
          intervene();
          uVar11 = mt_random();
          u.udg_cnt = uVar11 % 200 + 0x32;
        }
      }
      restore_attrib();
      bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar4 == '\0') {
        if ((u._1052_1_ & 2) == 0) {
          if ((u._1052_1_ & 0x20) != 0) {
            under_ground(0);
          }
        }
        else {
          under_water(0);
        }
      }
      else {
        movebubbles();
      }
      if (((multi < 0) && (multi = multi + 1, multi == 0)) &&
         (unmul((char *)0x0), u.utotype != '\0')) {
        deferred_goto();
      }
LAB_0013fdb3:
    } while (youmonst.movement < 0xc);
    if ((u.utrap != 0) && (u.utraptype == 3)) {
      bVar4 = is_lava(level,(int)u.ux,(int)u.uy);
      if (bVar4 == '\0') {
        u.utrap = 0;
      }
      else if ((u._1052_1_ & 0x10) == 0) {
        u.utrap = u.utrap - 0x100;
        if (u.utrap < 0x100) {
          killer_format = 1;
          killer = "molten lava";
          pline("You sink below the surface and die.");
          done(6);
        }
        else if (u.umoved == '\0') {
          Norep("You sink deeper into the lava.");
          uVar11 = mt_random();
          u.utrap = (uVar11 & 3) + u.utrap + 1;
        }
      }
    }
    iVar6 = prev_hp_notify;
    if ((iflags.hp_notify != '\0') && (iVar7 = uhp(), iVar6 != iVar7)) {
      pbVar18 = (byte *)"[HP%c%a=%h]";
      if (iflags.hp_notify_fmt != (char *)0x0) {
        pbVar18 = (byte *)iflags.hp_notify_fmt;
      }
      hp_notify_format_str_buf = 0;
      bVar5 = *pbVar18;
      if (bVar5 == 0) {
        __s = &hp_notify_format_str_buf;
      }
      else {
        bVar1 = false;
        pbVar19 = &hp_notify_format_str_buf;
        do {
          iVar6 = prev_hp_notify;
          __s = pbVar19;
          if (&DAT_003183f6 < pbVar19) {
            __s = &DAT_003183f6;
          }
          if (bVar1) {
            if (bVar5 < 99) {
              if (bVar5 == 0x48) {
                iVar6 = uhp();
                iVar7 = uhpmax();
                if (iVar6 == iVar7) {
                  __format = "%s";
                  pcVar13 = "max";
                }
                else {
                  iVar6 = uhp();
                  pcVar13 = (char *)(long)iVar6;
                  __format = "%ld";
                }
                snprintf((char *)__s,0x3183f7 - (long)__s,__format,pcVar13);
                if ((byte *)0x3183f5 < pbVar19) {
                  pbVar19 = &DAT_003183f6;
                }
                __s = pbVar19 + -1;
                do {
                  pbVar19 = __s + 1;
                  __s = __s + 1;
                } while (*pbVar19 != 0);
              }
              else {
                if (bVar5 != 0x61) goto LAB_00140048;
                iVar6 = uhp();
                uVar9 = iVar6 - prev_hp_notify;
                uVar11 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar11 = uVar9;
                }
                snprintf((char *)__s,0x3183f7 - (long)__s,"%ld",(ulong)uVar11);
                if ((byte *)0x3183f5 < pbVar19) {
                  pbVar19 = &DAT_003183f6;
                }
                __s = pbVar19 + -1;
                do {
                  pbVar19 = __s + 1;
                  __s = __s + 1;
                } while (*pbVar19 != 0);
              }
            }
            else {
              if (bVar5 == 99) {
                iVar7 = uhp();
                bVar1 = false;
                snprintf((char *)__s,0x3183f7 - (long)__s,"%c",
                         (ulong)((uint)(iVar7 < iVar6) * 2 + 0x2b));
                __s = __s + 1;
                goto LAB_0014014b;
              }
              if (bVar5 == 0x68) {
                iVar6 = uhp();
                snprintf((char *)__s,0x3183f7 - (long)__s,"%ld",(long)iVar6);
                if ((byte *)0x3183f5 < pbVar19) {
                  pbVar19 = &DAT_003183f6;
                }
                __s = pbVar19 + -1;
                do {
                  pbVar19 = __s + 1;
                  __s = __s + 1;
                } while (*pbVar19 != 0);
              }
              else {
                if (bVar5 != 0x6d) goto LAB_00140048;
                iVar6 = uhpmax();
                snprintf((char *)__s,0x3183f7 - (long)__s,"%ld",(long)iVar6);
                if ((byte *)0x3183f5 < pbVar19) {
                  pbVar19 = &DAT_003183f6;
                }
                __s = pbVar19 + -1;
                do {
                  pbVar19 = __s + 1;
                  __s = __s + 1;
                } while (*pbVar19 != 0);
              }
            }
LAB_00140149:
            bVar1 = false;
          }
          else {
            bVar1 = true;
            if (bVar5 != 0x25) {
LAB_00140048:
              *__s = bVar5;
              __s = __s + (__s < &DAT_003183f6);
              goto LAB_00140149;
            }
          }
LAB_0014014b:
          bVar5 = pbVar18[1];
          pbVar18 = pbVar18 + 1;
          pbVar19 = __s;
        } while (bVar5 != 0);
      }
      *__s = 0;
      pline("%s",&hp_notify_format_str_buf);
      prev_hp_notify = uhp();
    }
  }
  xmalloc_cleanup();
  iflags.next_msg_nonblocking = '\0';
  flags.move = '\x01';
  pre_move_tasks(bVar14);
  if (flags.run != 0) {
    delay_start = 0;
  }
  if (((delay_start != 0) && (multi == 0)) && (occupation == (_func_int *)0x0)) {
    if ((iflags.delay_msg != '\0') && (1 < moves - delay_start)) {
      pline("[%d turns]");
    }
    delay_start = 0;
  }
  if ((multi == 0) && (occupation == (_func_int *)0x0)) {
    flush_screen();
    maybe_tutorial();
  }
  return -1;
}

Assistant:

int command_input(int cmdidx, int rep, struct nh_cmd_arg *arg)
{
    boolean didmove = FALSE;
    
    if (multi >= 0 && occupation)
	handle_occupation();
    else if (multi == 0 || (multi > 0 && cmdidx != -1)) {
	saved_cmd = cmdidx;
	do_command(cmdidx, rep, TRUE, arg);
    } else if (multi > 0) {
	/* allow interruption of multi-turn commands */
	if (rep == -1) {
	    nomul(0, NULL);
	    return READY_FOR_INPUT;
	}
	
	if (flags.mv) {
	    if (multi < COLNO && !--multi)
		flags.travel = iflags.travel1 = flags.mv = flags.run = 0;
	    if (!domove(u.dx, u.dy, 0)) {
		/* Don't use a move when travelling into an obstacle. */
		flags.move = FALSE;
		nomul(0, NULL);
	    }
	} else
	    do_command(saved_cmd, multi, FALSE, arg);
    }
    /* no need to do anything here for multi < 0 */
    
    if (u.utotype)		/* change dungeon level */
	deferred_goto();	/* after rhack() */
    /* !flags.move here: multiple movement command stopped */
    else if (!flags.move || !flags.mv)
	iflags.botl = 1;

    if (vision_full_recalc)
	vision_recalc(0);	/* vision! */
    /* when running in non-tport mode, this gets done through domove() */
    if ((!flags.run || iflags.runmode == RUN_TPORT) &&
	    (multi && (!flags.travel ? !(multi % 7) : !(moves % 7L)))) {
	if (flags.run)
	    iflags.botl = 1;
	flush_screen();
    }
    
    didmove = flags.move;
    if (didmove) {
	you_moved();
    } /* actual time passed */

    /****************************************/
    /* once-per-player-input things go here */
    /****************************************/
    xmalloc_cleanup();
    iflags.next_msg_nonblocking = FALSE;

    /* prepare for the next move */
    flags.move = 1;
    pre_move_tasks(didmove);
    do_delay_msg();
    if (multi == 0 && !occupation) {
	flush_screen(); /* Flush screen buffer */
	maybe_tutorial();
    }
    
    return -1;
}